

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O2

void __thiscall
gimage::TIFFImageIO::load
          (TIFFImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  int iVar1;
  IOException *pIVar2;
  long lVar3;
  long lVar4;
  uint16_t d;
  ushort d_00;
  long k;
  ulong uVar5;
  long k_1;
  allocator local_1f9;
  ulong local_1f8;
  uint16_t format;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixel;
  uint16_t planar;
  ulong local_178;
  long local_170;
  long local_168;
  TiffImage<unsigned_char> tif;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar5 = (ulong)(uint)ds;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image(&tif.rows,0,0,1);
  tif.raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tif.raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tif.row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tif.raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tif.row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tif.row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tif.tif = (TIFF *)TIFFOpen(name,"r");
  if (tif.tif == (TIFF *)0x0) {
    pIVar2 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&pixel,name,(allocator *)&local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&planar,
                   "Can only load TIFF image (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixel);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&format,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&planar,")")
    ;
    gutil::IOException::IOException(pIVar2,(string *)&format);
    __cxa_throw(pIVar2,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  TIFFGetField(tif.tif,0x100,&tif.width);
  TIFFGetField(tif.tif,0x101);
  TIFFGetField(tif.tif,0x115);
  TIFFGetField(tif.tif,0x102);
  TIFFGetField(tif.tif,0x153,&format);
  TIFFGetField(tif.tif,0x11c,&planar);
  tif.is_float = format == 3;
  tif.is_planar = planar == 2;
  tif.raw_size = TIFFScanlineSize(tif.tif);
  TIFFGetField(tif.tif,0x106);
  if (8 < tif.bits) {
    pIVar2 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_70,name,&local_1f9);
    std::operator+(&local_50,"Image ",&local_70);
    std::operator+(&local_d0,&local_50," has ");
    std::__cxx11::to_string(&local_90,(uint)tif.bits);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixel,
                   &local_d0,&local_90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&planar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixel,
                   " bits per sample, but target image only ");
    std::__cxx11::to_string(&local_b0,8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&format,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&planar,
                   &local_b0);
    gutil::IOException::IOException(pIVar2,(string *)&format);
    __cxa_throw(pIVar2,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_1f8 = w;
  if (w < 0) {
    local_1f8 = (ulong)((tif.width + ds) - 1) / (ulong)(uint)ds;
  }
  if (h < 0) {
    h = ((tif.height + ds) - 1) / uVar5;
  }
  if (tif.photometric < 3) {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (image,(ulong)tif.width,(ulong)tif.height,(ulong)tif.depth);
    local_178 = uVar5;
    local_170 = x;
    local_168 = y;
    if (tif.is_planar == false) {
      for (uVar5 = 0; h != uVar5; uVar5 = uVar5 + 1) {
        anon_unknown_6::readRow<unsigned_char>(image,(uint32_t)uVar5,&tif,(uint32_t)uVar5,0);
      }
    }
    else {
      for (d_00 = 0; d_00 < tif.depth; d_00 = d_00 + 1) {
        for (uVar5 = 0; h != uVar5; uVar5 = uVar5 + 1) {
          anon_unknown_6::readRow<unsigned_char>(image,(uint32_t)uVar5,&tif,(uint32_t)uVar5,d_00);
        }
      }
    }
    lVar4 = local_168;
    lVar3 = local_170;
    if (1 < (int)local_178) {
      downscaleImage<unsigned_char>
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&format,image,
                 (int)local_178);
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator=
                (image,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&format);
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&format);
    }
    if (((lVar4 == 0 && lVar3 == 0) && (local_1f8 == image->width)) && (h == image->height))
    goto LAB_00139355;
    cropImage<unsigned_char>
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&format,image,lVar3,
               lVar4,local_1f8,h);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&pixel,(ulong)(tif.height * tif.width),(allocator_type *)&format);
    iVar1 = TIFFReadRGBAImageOriented
                      (tif.tif,tif.width,tif.height,
                       pixel.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_start,1,1);
    if (iVar1 < 1) {
      pIVar2 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&planar,name,(allocator *)&local_d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&format,
                     "Cannot load image ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&planar);
      gutil::IOException::IOException(pIVar2,(string *)&format);
      __cxa_throw(pIVar2,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (image,(ulong)tif.width,(ulong)tif.height,3);
    for (lVar3 = 0; lVar3 < image->height; lVar3 = lVar3 + 1) {
      for (lVar4 = 0; lVar4 < image->width; lVar4 = lVar4 + 1) {
        (*image->img)[lVar3][lVar4] =
             (uchar)*pixel.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
        image->img[1][lVar3][lVar4] =
             *(uchar *)((long)pixel.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + 1);
        image->img[2][lVar3][lVar4] =
             *(uchar *)((long)pixel.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + 2);
        pixel.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             pixel.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&pixel.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    if (1 < ds) {
      downscaleImage<unsigned_char>
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&format,image,ds);
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator=
                (image,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&format);
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&format);
    }
    if (((y == 0 && x == 0) && (local_1f8 == image->width)) && (h == image->height))
    goto LAB_00139355;
    cropImage<unsigned_char>
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&format,image,x,y,
               local_1f8,h);
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator=
            (image,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&format);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
            ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&format);
LAB_00139355:
  anon_unknown_6::TiffImage<unsigned_char>::~TiffImage(&tif);
  return;
}

Assistant:

void TIFFImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y, long w, long h) const
{
  loadInternal(image, name, ds, x, y, w, h);
}